

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAcurv::ArchiveOUT(ChNodeFEAcurv *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChNodeFEAcurv>(marchive);
  ChNodeBase::ArchiveOUT
            ((ChNodeBase *)
             ((long)(this->m_ryy).m_data +
             (long)((this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + -0x38)),marchive);
  local_38._value = (ChVector<double> *)&(this->super_ChNodeFEAbase).field_0x20;
  local_38._name = "m_rxx";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_ryy;
  local_38._name = "m_ryy";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_rzz;
  local_38._name = "m_rzz";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_rxx_dt;
  local_38._name = "m_rxx_dt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_ryy_dt;
  local_38._name = "m_ryy_dt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_rzz_dt;
  local_38._name = "m_rzz_dt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_rxx_dtdt;
  local_38._name = "m_rxx_dtdt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_ryy_dtdt;
  local_38._name = "m_ryy_dtdt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_rzz_dtdt;
  local_38._name = "m_rzz_dtdt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChNodeFEAcurv::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAcurv>();
    // serialize parent class
    ChNodeFEAbase::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_rxx);
    marchive << CHNVP(m_ryy);
    marchive << CHNVP(m_rzz);
    marchive << CHNVP(m_rxx_dt);
    marchive << CHNVP(m_ryy_dt);
    marchive << CHNVP(m_rzz_dt);
    marchive << CHNVP(m_rxx_dtdt);
    marchive << CHNVP(m_ryy_dtdt);
    marchive << CHNVP(m_rzz_dtdt);
}